

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O3

Am_Wrapper * dialog_items_proc(Am_Object *self)

{
  Am_Value *this;
  Am_Wrapper *pAVar1;
  Am_Object AStack_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)self,10);
  Am_Object::Get_Object(&AStack_18,(Am_Slot_Key)&local_10,10);
  this = Am_Object::Get(&AStack_18,0xa2,0);
  pAVar1 = Am_Value::operator_cast_to_Am_Wrapper_(this);
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::~Am_Object(&local_10);
  return pAVar1;
}

Assistant:

Am_Define_Formula(Am_Wrapper *, dialog_items)
{
  return self.Get_Owner().Get_Owner().Get(Am_ITEMS);
}